

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

Bridges * __thiscall
Graph::determined_bridges_search(Bridges *__return_storage_ptr__,Graph *this,bool param_1)

{
  pointer pCVar1;
  uint64_t v;
  uint64_t timer;
  uint64_t local_28;
  
  clear(this);
  local_28 = 0;
  pCVar1 = (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if ((this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>._M_impl.
      super__Vector_impl_data._M_finish != pCVar1) {
    v = 0;
    do {
      if (pCVar1[v] != Black) {
        dfsForDeterm(this,v,&local_28,0xffffffffffffffff);
      }
      v = v + 1;
      pCVar1 = (this->colorMap).super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
               _M_impl.super__Vector_impl_data._M_start;
    } while (v < (ulong)((long)(this->colorMap).
                               super__Vector_base<Graph::Colors,_std::allocator<Graph::Colors>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)pCVar1 >> 2));
  }
  std::vector<Graph::LightEdge,_std::allocator<Graph::LightEdge>_>::vector
            (__return_storage_ptr__,&this->bridges);
  return __return_storage_ptr__;
}

Assistant:

Graph::Bridges Graph::determined_bridges_search(bool) {
    clear();
    std::uint64_t timer = 0;
    for (std::uint64_t i = 0; i < colorMap.size(); ++i)
        if (colorMap[i] != Colors::Black)
            Graph::dfsForDeterm(i, timer);
    return bridges;
}